

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_38a::NinjaMain::CollectTargetsFromArgs
          (NinjaMain *this,int argc,char **argv,vector<Node_*,_std::allocator<Node_*>_> *targets,
          string *err)

{
  pointer *pppNVar1;
  iterator __position;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  vector<Node_*,_std::allocator<Node_*>_> local_48;
  
  if (argc == 0) {
    State::DefaultNodes(&local_48,&this->state_,err);
    std::vector<Node_*,_std::allocator<Node_*>_>::_M_move_assign(targets,&local_48);
    if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    bVar5 = err->_M_string_length == 0;
  }
  else {
    bVar5 = argc < 1;
    if ((0 < argc) &&
       (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CollectTarget(this,*argv,err),
       (Node *)local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start != (Node *)0x0)) {
      uVar3 = (ulong)(uint)argc;
      uVar2 = 1;
      do {
        uVar4 = uVar2;
        __position._M_current =
             (targets->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (targets->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)targets,__position,(Node **)&local_48);
        }
        else {
          *__position._M_current =
               (Node *)local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          pppNVar1 = &(targets->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
        if (uVar3 == uVar4) {
          return uVar3 <= uVar4;
        }
        local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CollectTarget(this,argv[uVar4],err);
        uVar2 = uVar4 + 1;
      } while ((Node *)local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start != (Node *)0x0);
      bVar5 = uVar3 <= uVar4;
    }
  }
  return bVar5;
}

Assistant:

bool NinjaMain::CollectTargetsFromArgs(int argc, char* argv[],
                                       vector<Node*>* targets, string* err) {
  if (argc == 0) {
    *targets = state_.DefaultNodes(err);
    return err->empty();
  }

  for (int i = 0; i < argc; ++i) {
    Node* node = CollectTarget(argv[i], err);
    if (node == NULL)
      return false;
    targets->push_back(node);
  }
  return true;
}